

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O1

int av1_log_block_avg(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs,int mi_row,int mi_col)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  
  iVar1 = (cpi->common).height;
  uVar8 = CONCAT71(in_register_00000011,bs) & 0xffffffff;
  iVar3 = mi_row * 4;
  iVar6 = ((uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar8]
          + mi_row) * 4;
  if (iVar1 <= iVar6) {
    iVar6 = iVar1;
  }
  uVar2 = 0;
  uVar5 = 0;
  uVar4 = 0;
  if (iVar3 < iVar6) {
    iVar1 = (cpi->common).width;
    iVar7 = ((uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [uVar8] + mi_col) * 4;
    if (iVar1 <= iVar7) {
      iVar7 = iVar1;
    }
    uVar4 = 0;
    uVar5 = 0;
    do {
      if (mi_col * 4 < iVar7) {
        lVar9 = (long)(mi_col * 4);
        do {
          uVar4 = uVar4 + *(ushort *)
                           ((long)x->plane[0].src.buf * 2 +
                            (long)iVar3 * (long)x->plane[0].src.stride * 2 + lVar9 * 2);
          lVar9 = lVar9 + 1;
        } while (iVar7 != lVar9);
        uVar5 = uVar5 + iVar7 + mi_col * -4;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != iVar6);
  }
  if (uVar5 != 0) {
    uVar2 = uVar4 / uVar5;
  }
  return uVar2;
}

Assistant:

int av1_log_block_avg(const AV1_COMP *cpi, const MACROBLOCK *x, BLOCK_SIZE bs,
                      int mi_row, int mi_col) {
  // This functions returns the block average of luma block
  unsigned int sum, avg, num_pix;
  int r, c;
  const int pic_w = cpi->common.width;
  const int pic_h = cpi->common.height;
  const int bw = MI_SIZE * mi_size_wide[bs];
  const int bh = MI_SIZE * mi_size_high[bs];
  const uint16_t *x16 = CONVERT_TO_SHORTPTR(x->plane[0].src.buf);

  sum = 0;
  num_pix = 0;
  avg = 0;
  int row = mi_row << MI_SIZE_LOG2;
  int col = mi_col << MI_SIZE_LOG2;
  for (r = row; (r < (row + bh)) && (r < pic_h); r++) {
    for (c = col; (c < (col + bw)) && (c < pic_w); c++) {
      sum += *(x16 + r * x->plane[0].src.stride + c);
      num_pix++;
    }
  }
  if (num_pix != 0) {
    avg = sum / num_pix;
  }
  return avg;
}